

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O2

Var BailOutRecord::BailOutHelper
              (JavascriptCallStackLayout *layout,ScriptFunction **functionRef,Arguments *args,
              bool isInlinee,BailOutRecord *bailOutRecord,uint32 bailOutOffset,void *returnAddress,
              BailOutKind bailOutKind,Var *registerSaves,BailOutReturnValue *bailOutReturnValue,
              Var *pArgumentsObject,Var branchValue,void *argoutRestoreAddress)

{
  undefined1 *puVar1;
  ImplicitCallFlags flags;
  Type TVar2;
  DebugManager *this;
  ThreadContext *this_00;
  ScriptFunction *scriptFunction;
  JavascriptFunction *pJVar3;
  code *pcVar4;
  ushort uVar5;
  JavascriptCallStackLayout *pJVar6;
  bool bVar7;
  byte bVar8;
  ushort uVar9;
  uint uVar10;
  uint uVar11;
  LocalFunctionId LVar12;
  int iVar13;
  RegSlot RVar14;
  RegSlot RVar15;
  RegSlot localRegisterID;
  FunctionBody *pFVar16;
  ScriptContext *pSVar17;
  DebuggingFlags *this_01;
  undefined7 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  char16 *pcVar18;
  char16 *pcVar19;
  char *pcVar20;
  undefined4 extraout_var_03;
  Type TVar21;
  Var pvVar22;
  undefined4 *puVar23;
  Var pvVar24;
  Var *allocation;
  LoopHeader *loopHeaderArray;
  Var *ppvVar25;
  ByteCodeReader *this_02;
  ForInObjectEnumerator *pFVar26;
  Var *ppvVar27;
  FrameDisplay *pFVar28;
  ScriptFunction *pSVar29;
  DynamicProfileInfo *this_03;
  undefined7 in_register_00000009;
  undefined8 uVar30;
  GlobalBailOutRecordDataTable *pGVar31;
  ulong uVar32;
  Var *ppvVar33;
  uint32 i_1;
  uint32 index;
  Arguments *args_00;
  uint i;
  ulong uVar34;
  Var *stackAllocation;
  BailOutRecord *pBVar35;
  Var local_128;
  char16 debugStringBuffer [42];
  JavascriptGenerator *generator;
  uint local_a8;
  uint local_a4;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *local_90;
  ArenaAllocator *tmpAlloc;
  NumberSet *local_80;
  JavascriptCallStackLayout *local_78;
  ScriptContext *local_70;
  ScriptFunction *local_68;
  ThreadContext *local_60;
  Arguments *local_58;
  undefined4 local_50;
  undefined4 local_4c;
  char local_45;
  uint local_44;
  BailOutRecord *local_40;
  FunctionBody *local_38;
  
  uVar30 = CONCAT71(in_register_00000009,isInlinee);
  ppvVar27 = &local_128;
  ppvVar33 = &local_128;
  local_50 = (undefined4)uVar30;
  local_68 = *functionRef;
  tmpAlloc = (ArenaAllocator *)functionRef;
  local_78 = layout;
  local_44 = bailOutOffset;
  pFVar16 = Js::JavascriptFunction::GetFunctionBody((JavascriptFunction *)local_68);
  pSVar17 = Js::FunctionProxy::GetScriptContext((FunctionProxy *)pFVar16);
  pSVar17->threadContext->disableImplicitFlags = DisableImplicitNoFlag;
  local_38 = pFVar16;
  local_45 = Js::FunctionProxy::IsInDebugMode((FunctionProxy *)pFVar16);
  local_4c = (undefined4)CONCAT71((int7)((ulong)uVar30 >> 8),1);
  local_70 = pSVar17;
  local_58 = args;
  local_40 = bailOutRecord;
  if ((bool)local_45) {
    this = pSVar17->threadContext->debugManager;
    this_01 = Js::DebugManager::GetDebuggingFlags(this);
    uVar10 = DebuggingFlags::GetByteCodeOffsetAfterIgnoreException(this_01);
    if (((bailOutKind >> 0x1b & 1) != 0) || (uVar10 != 0xffffffff)) {
      uVar11 = DebuggingFlags::GetFuncNumberAfterIgnoreException(this_01);
      if (uVar11 == 0) {
LAB_003e4c72:
        if (uVar10 == 0xffffffff) {
          uVar11 = DebuggingFlags::GetFuncNumberAfterIgnoreException(this_01);
          if (uVar11 != 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar23 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar23 = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                               ,0x5af,
                               "(!(byteCodeOffsetAfterEx == DebuggingFlags::InvalidByteCodeOffset && debuggingFlags->GetFuncNumberAfterIgnoreException() != DebuggingFlags::InvalidFuncNumber))"
                               ,
                               "!(byteCodeOffsetAfterEx == DebuggingFlags::InvalidByteCodeOffset && debuggingFlags->GetFuncNumberAfterIgnoreException() != DebuggingFlags::InvalidFuncNumber)"
                              );
            if (!bVar7) goto LAB_003e5c94;
            *puVar23 = 0;
          }
          goto LAB_003e4f95;
        }
        bVar7 = Js::StepController::IsActive(&this->stepController);
        pFVar16 = local_38;
        if (bVar7) {
          (this->stepController).frameAddrWhenSet = 0;
        }
        if (((bailOutKind >> 0x1b & 1) == 0) || (uVar10 != local_44)) {
          uVar11 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)local_38);
          LVar12 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar16);
          bVar7 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,BailOutPhase,uVar11,LVar12);
          if (((bVar7) &&
              ((bailOutKind != BailOnSimpleJitToFullJitLoopBody || (DAT_0145948a == '\x01')))) &&
             ((DAT_0145c3a8 == DAT_0145c3b0 ||
              (bVar7 = Js::NumberSet::Contains((NumberSet *)&DAT_0145c388,bailOutKind), bVar7)))) {
            pFVar16 = local_38;
            iVar13 = (*(local_38->super_ParseableFunctionInfo).super_FunctionProxy.
                       super_FinalizableObject.super_IRecyclerVisitedObject.
                       _vptr_IRecyclerVisitedObject[7])(local_38);
            local_60 = (ThreadContext *)CONCAT44(extraout_var_00,iVar13);
            pcVar18 = Js::FunctionProxy::GetDebugNumberSet
                                ((FunctionProxy *)pFVar16,(wchar (*) [42])&local_128);
            pcVar19 = Js::OpCodeUtil::GetOpCodeName(local_40->bailOutOpcode);
            pcVar20 = GetBailOutKindName(BailOutIgnoreException);
            Output::Print(L"BailOut: changing due to ignore exception: function: %s (%s) offset: #%04x -> #%04x Opcode: %s Treating as: %S"
                          ,local_60,pcVar18,(ulong)local_44,(ulong)uVar10,pcVar19,pcVar20);
            if (bailOutKind != BailOutInvalid) {
              pcVar20 = GetBailOutKindName(bailOutKind);
              Output::Print(L" Kind: %S",pcVar20);
            }
            Output::Print(L"\n");
          }
          pFVar16 = local_38;
          uVar11 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)local_38);
          LVar12 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar16);
          bVar7 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,BailOutPhase,uVar11,LVar12);
          if (((bVar7) &&
              ((bailOutKind != BailOnSimpleJitToFullJitLoopBody || (DAT_0145948a == '\x01')))) &&
             ((DAT_0145c3a8 == DAT_0145c3b0 ||
              (bVar7 = Js::NumberSet::Contains((NumberSet *)&DAT_0145c388,bailOutKind), bVar7)))) {
            iVar13 = (*(local_38->super_ParseableFunctionInfo).super_FunctionProxy.
                       super_FinalizableObject.super_IRecyclerVisitedObject.
                       _vptr_IRecyclerVisitedObject[7])();
            pcVar18 = Js::OpCodeUtil::GetOpCodeName(local_40->bailOutOpcode);
            pcVar20 = GetBailOutKindName(BailOutIgnoreException);
            Output::Print(L"BailOut: changing due to ignore exception: function %s, Opcode: %s, Treating as: %S"
                          ,CONCAT44(extraout_var_01,iVar13),pcVar18,pcVar20);
            if (bailOutKind != BailOutInvalid) {
              pcVar20 = GetBailOutKindName(bailOutKind);
              Output::Print(L" Kind: %S",pcVar20);
            }
            Output::Print(L"\n");
          }
          local_4c = 0;
        }
        else {
          local_4c = 0;
          uVar10 = local_44;
        }
      }
      else {
        uVar11 = DebuggingFlags::GetFuncNumberAfterIgnoreException(this_01);
        pFVar16 = Js::JavascriptFunction::GetFunctionBody((JavascriptFunction *)local_68);
        if (uVar11 == (pFVar16->super_ParseableFunctionInfo).super_FunctionProxy.m_functionNumber)
        goto LAB_003e4c72;
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar23 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar23 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                           ,0x5ab,"(isSameFunction)",
                           "Bailout due to ignore exception in different function, can\'t bail out cross functions!"
                          );
        if (!bVar7) goto LAB_003e5c94;
        *puVar23 = 0;
        local_4c = (undefined4)CONCAT71(extraout_var,1);
        uVar10 = local_44;
      }
      DebuggingFlags::ResetByteCodeOffsetAndFuncAfterIgnoreException(this_01);
      local_44 = uVar10;
    }
  }
LAB_003e4f95:
  pFVar16 = local_38;
  pBVar35 = local_40;
  args_00 = local_58;
  uVar11 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)local_38);
  LVar12 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar16);
  bVar7 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,BailOutPhase,uVar11,LVar12);
  if (((bVar7) && ((bailOutKind != BailOnSimpleJitToFullJitLoopBody || (DAT_0145948a == '\x01'))))
     && ((DAT_0145c3a8 == DAT_0145c3b0 ||
         (bVar7 = Js::NumberSet::Contains((NumberSet *)&DAT_0145c388,bailOutKind), bVar7)))) {
    pFVar16 = local_38;
    iVar13 = (*(local_38->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
               super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(local_38);
    pcVar18 = Js::FunctionProxy::GetDebugNumberSet
                        ((FunctionProxy *)pFVar16,(wchar (*) [42])&local_128);
    pcVar19 = Js::OpCodeUtil::GetOpCodeName(pBVar35->bailOutOpcode);
    Output::Print(L"BailOut: function: %s (%s) offset: #%04x Opcode: %s",
                  CONCAT44(extraout_var_02,iVar13),pcVar18,(ulong)local_44,pcVar19);
    if (bailOutKind != BailOutInvalid) {
      pcVar20 = GetBailOutKindName(bailOutKind);
      Output::Print(L" Kind: %S",pcVar20);
    }
    Output::Print(L"\n");
    pBVar35 = local_40;
  }
  pFVar16 = local_38;
  uVar11 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)local_38);
  LVar12 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar16);
  bVar7 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,BailOutPhase,uVar11,LVar12);
  if (((bVar7) && ((bailOutKind != BailOnSimpleJitToFullJitLoopBody || (DAT_0145948a == '\x01'))))
     && ((DAT_0145c3a8 == DAT_0145c3b0 ||
         (bVar7 = Js::NumberSet::Contains((NumberSet *)&DAT_0145c388,bailOutKind), bVar7)))) {
    iVar13 = (*(local_38->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
               super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])();
    pcVar18 = Js::OpCodeUtil::GetOpCodeName(pBVar35->bailOutOpcode);
    Output::Print(L"BailOut: function %s, Opcode: %s",CONCAT44(extraout_var_03,iVar13),pcVar18);
    if (bailOutKind != BailOutInvalid) {
      GetBailOutKindName(bailOutKind);
      Output::Print(L" Kind: %S");
    }
    Output::Print(L"\n");
  }
  if (((char)local_50 != '\0') && (TVar21 = args_00->Info, ((ulong)TVar21 & 0xffffff) != 0)) {
    local_60 = (ThreadContext *)&DAT_01453738;
    local_80 = (NumberSet *)&DAT_0145c388;
    for (uVar34 = 0; pFVar16 = local_38, uVar34 < (TVar21._0_4_ & 0xffffff); uVar34 = uVar34 + 1) {
      pvVar24 = args_00->Values[uVar34];
      if (DAT_0145948a == '\x01') {
        uVar11 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)local_38);
        LVar12 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar16);
        bVar7 = Js::Phases::IsEnabled((Phases *)local_60,BailOutPhase,uVar11,LVar12);
        if ((bVar7) &&
           ((DAT_0145c3a8 == DAT_0145c3b0 ||
            (bVar7 = Js::NumberSet::Contains(local_80,bailOutKind), bVar7)))) {
          Output::Print(L"BailOut:   Argument #%3u: value: 0x%p",uVar34 & 0xffffffff,pvVar24);
        }
      }
      pvVar22 = Js::JavascriptOperators::BoxStackInstance(pvVar24,local_70,true,false);
      pFVar16 = local_38;
      args_00 = local_58;
      if ((pvVar22 != pvVar24) && (local_58->Values[uVar34] = pvVar22, DAT_0145948a == '\x01')) {
        uVar11 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)local_38);
        LVar12 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar16);
        args_00 = local_58;
        bVar7 = Js::Phases::IsEnabled((Phases *)local_60,BailOutPhase,uVar11,LVar12);
        if ((bVar7) &&
           ((DAT_0145c3a8 == DAT_0145c3b0 ||
            (bVar7 = Js::NumberSet::Contains(local_80,bailOutKind), bVar7)))) {
          Output::Print(L" (Boxed: 0x%p)");
        }
      }
      pFVar16 = local_38;
      if (DAT_0145948a == '\x01') {
        uVar11 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)local_38);
        LVar12 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar16);
        bVar7 = Js::Phases::IsEnabled((Phases *)local_60,BailOutPhase,uVar11,LVar12);
        if ((bVar7) &&
           ((DAT_0145c3a8 == DAT_0145c3b0 ||
            (bVar7 = Js::NumberSet::Contains(local_80,bailOutKind), bVar7)))) {
          Output::Print(L"\n");
        }
      }
      TVar21 = args_00->Info;
    }
  }
  bVar7 = Js::FunctionProxy::IsCoroutine((FunctionProxy *)local_38);
  pBVar35 = local_40;
  if (bVar7) {
    if (((ulong)args_00->Info & 0xffffff) != 2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar23 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar23 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                         ,0x600,"(args.Info.Count == 2)",
                         "Generator ScriptFunctions should only be invoked by generator APIs with the pair of arguments they pass in -- the generator object and a resume yield object"
                        );
      if (!bVar7) goto LAB_003e5c94;
      *puVar23 = 0;
    }
    pvVar24 = Js::Arguments::operator[](args_00,0);
    register0x00000000 = Js::VarTo<Js::JavascriptGenerator>(pvVar24);
    this_02 = (ByteCodeReader *)(register0x00000000->frame).ptr;
    if (this_02 == (ByteCodeReader *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar23 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar23 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                         ,0x608,"(newInstance != nullptr)","newInstance != nullptr");
      if (!bVar7) goto LAB_003e5c94;
      *puVar23 = 0;
      pBVar35 = local_40;
    }
    Js::InterpreterStackFrame::ResetOut((InterpreterStackFrame *)this_02);
    this_02[7].m_endLocation = (byte *)(debugStringBuffer + 0x28);
  }
  else {
    Js::InterpreterStackFrame::Setup::Setup
              ((Setup *)(debugStringBuffer + 0x28),local_68,args_00,true,(bool)(char)local_50,false)
    ;
    pSVar17 = local_70;
    uVar32 = (ulong)local_a4;
    uVar34 = uVar32 + local_a8;
    if (uVar34 < 0x8001) {
      ThreadContext::ProbeStack(local_70->threadContext,uVar34 * 8 + 0x4000,local_70,returnAddress);
      ppvVar27 = (Var *)((long)&local_128 - (uVar34 * 8 + 0xf & 0xfffffffffffffff0));
      allocation = ppvVar27;
LAB_003e54f5:
      stackAllocation = (Var *)0x0;
    }
    else {
      local_90 = (ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)0x0;
      Js::ScriptContext::EnsureInterpreterArena(local_70,(ArenaAllocator **)&local_90);
      allocation = (Var *)Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                          ::AllocInternal(local_90,(ulong)local_a8 << 3);
      if (uVar32 == 0) goto LAB_003e54f5;
      ThreadContext::ProbeStack(pSVar17->threadContext,uVar32 * 8 + 0x4000,pSVar17,returnAddress);
      ppvVar27 = (Var *)((long)&local_128 - (uVar32 * 8 + 0xf & 0xfffffffffffffff0));
      stackAllocation = ppvVar27;
    }
    pFVar16 = local_38;
    ppvVar27[-1] = (Var)0x3e5507;
    bVar7 = Js::FunctionBody::GetHasAllocatedLoopHeaders(pFVar16);
    if (bVar7) {
      ppvVar27[-1] = (Var)0x3e5513;
      loopHeaderArray = Js::FunctionBody::GetLoopHeaderArrayPtr(pFVar16);
    }
    else {
      loopHeaderArray = (LoopHeader *)0x0;
    }
    pJVar6 = local_78;
    ppvVar27[-1] = (Var)0x3e5524;
    ppvVar25 = Js::JavascriptCallStackLayout::GetArgv(pJVar6);
    ppvVar27[-2] = (Var)0xfefefefefefefefe;
    ppvVar27[-1] = (Var)0xfefefefefefefefe;
    ppvVar27[-3] = ppvVar27 + -2;
    ppvVar27[-4] = ppvVar25;
    ppvVar27[-5] = (Var)0x3e5556;
    this_02 = (ByteCodeReader *)
              Js::InterpreterStackFrame::Setup::InitializeAllocation
                        ((Setup *)(debugStringBuffer + 0x28),allocation,stackAllocation,false,false,
                         loopHeaderArray,(DWORD_PTR)ppvVar27[-4],ppvVar27[-3]);
    ppvVar33 = ppvVar27 + -2;
    ppvVar27[-3] = (Var)0x3e5568;
    Js::ByteCodeReader::Create(this_02,pFVar16,0);
    pBVar35 = local_40;
  }
  pJVar6 = local_78;
  iVar13 = pBVar35->globalBailOutRecordTable->forInEnumeratorArrayRestoreOffset;
  if (iVar13 != -1) {
    *(undefined8 *)((long)ppvVar33 + -8) = 0x3e5580;
    pFVar26 = Js::JavascriptCallStackLayout::GetForInObjectEnumeratorArrayAtOffset(pJVar6,iVar13);
    this_02[4].m_endLocation = (byte *)pFVar26;
  }
  this_02[0xe].m_startLocation = (byte *)pBVar35->ehBailoutData;
  uVar5 = (ushort)*(undefined4 *)((long)&this_02[8].m_endLocation + 4);
  uVar9 = uVar5 | 8;
  *(ushort *)((long)&this_02[8].m_endLocation + 4) = uVar9;
  if (bailOutKind == BailOutOnArrayAccessHelperCall) {
    uVar9 = 0x18;
LAB_003e55ba:
    uVar9 = uVar9 | uVar5;
    *(ushort *)((long)&this_02[8].m_endLocation + 4) = uVar9;
  }
  else if (bailOutKind == BailOutOnNotNativeArray) {
    uVar9 = 0x88;
    goto LAB_003e55ba;
  }
  if ((char)local_50 != '\0') {
    *(ushort *)((long)&this_02[8].m_endLocation + 4) = uVar9 | 0x40;
  }
  this_00 = *(ThreadContext **)(this_02[5].m_startLocation + 0x3b8);
  if ((bailOutKind & ~(BailOutKindBits|BailOutIntOnly)) != BailOutOnImplicitCalls) {
    *(undefined8 *)((long)ppvVar33 + -8) = 0x3e55f7;
    ThreadContext::ClearImplicitCallFlags(this_00);
  }
  pSVar29 = local_68;
  local_60 = this_00;
  *(undefined8 *)((long)ppvVar33 + -8) = 0x3e5607;
  pFVar16 = Js::JavascriptFunction::GetFunctionBody((JavascriptFunction *)pSVar29);
  *(undefined8 *)((long)ppvVar33 + -8) = 0x3e560f;
  RVar14 = Js::FunctionBody::GetVarCount(pFVar16);
  if (RVar14 != 0) {
    *(undefined8 *)((long)ppvVar33 + -8) = 0x3e561e;
    pFVar16 = Js::JavascriptFunction::GetFunctionBody((JavascriptFunction *)pSVar29);
    *(undefined8 *)((long)ppvVar33 + -8) = 0x3e5626;
    RVar15 = Js::FunctionBody::GetConstantCount(pFVar16);
    *(undefined8 *)((long)ppvVar33 + -8) = 0x3e5641;
    memset(&this_02[0xe].m_endLocation + RVar15,0,(ulong)RVar14 << 3);
  }
  pFVar16 = local_38;
  *(undefined8 *)((long)ppvVar33 + -8) = 0x3e564d;
  RVar14 = Js::FunctionBody::GetLocalFrameDisplayRegister(pFVar16);
  *(undefined8 *)((long)ppvVar33 + -8) = 0x3e5658;
  RVar15 = Js::FunctionBody::GetLocalClosureRegister(pFVar16);
  *(undefined8 *)((long)ppvVar33 + -8) = 0x3e5663;
  localRegisterID = Js::FunctionBody::GetParamClosureRegister(pFVar16);
  pJVar6 = local_78;
  if ((char)local_50 == '\0') {
    if (RVar14 != 0xffffffff) {
      TVar2 = (local_38->super_ParseableFunctionInfo).m_inParamCount;
      *(undefined8 *)((long)ppvVar33 + -8) = 0x3e5689;
      ppvVar27 = Js::JavascriptCallStackLayout::GetArgv(pJVar6);
      pFVar28 = (FrameDisplay *)ppvVar27[(ulong)(TVar2 == 0) - 7];
      *(undefined8 *)((long)ppvVar33 + -8) = 0x3e5699;
      Js::InterpreterStackFrame::SetLocalFrameDisplay((InterpreterStackFrame *)this_02,pFVar28);
    }
    pJVar6 = local_78;
    if (RVar15 != 0xffffffff) {
      TVar2 = (local_38->super_ParseableFunctionInfo).m_inParamCount;
      *(undefined8 *)((long)ppvVar33 + -8) = 0x3e56bd;
      ppvVar27 = Js::JavascriptCallStackLayout::GetArgv(pJVar6);
      pvVar24 = *(Var *)((long)ppvVar27 + ((ulong)(TVar2 == 0) << 3 | 0xffffffffffffffc0));
      *(undefined8 *)((long)ppvVar33 + -8) = 0x3e56cc;
      Js::InterpreterStackFrame::SetLocalClosure((InterpreterStackFrame *)this_02,pvVar24);
    }
  }
  pBVar35 = local_40;
  pSVar17 = local_70;
  pJVar6 = local_78;
  *(ulong *)((long)ppvVar33 + -0x18) = (ulong)(byte)local_4c;
  *(void **)((long)ppvVar33 + -0x20) = returnAddress;
  *(Var *)((long)ppvVar33 + -0x28) = branchValue;
  *(Var **)((long)ppvVar33 + -0x30) = pArgumentsObject;
  *(BailOutReturnValue **)((long)ppvVar33 + -0x38) = bailOutReturnValue;
  *(Var **)((long)ppvVar33 + -0x40) = registerSaves;
  *(undefined8 *)((long)ppvVar33 + -0x48) = 0x3e56fd;
  RestoreValues(pBVar35,bailOutKind,pJVar6,(InterpreterStackFrame *)this_02,pSVar17,false,
                *(Var **)((long)ppvVar33 + -0x40),*(BailOutReturnValue **)((long)ppvVar33 + -0x38),
                *(Var **)((long)ppvVar33 + -0x30),*(Var *)((long)ppvVar33 + -0x28),
                *(void **)((long)ppvVar33 + -0x20),*(bool *)((long)ppvVar33 + -0x18),
                *(void **)((long)ppvVar33 + -0x10));
  if (RVar14 != 0xffffffff) {
    *(undefined8 *)((long)ppvVar33 + -8) = 0x3e5712;
    pFVar28 = (FrameDisplay *)
              Js::InterpreterStackFrame::GetNonVarReg((InterpreterStackFrame *)this_02,RVar14);
    if (pFVar28 != (FrameDisplay *)0x0) {
      *(undefined8 *)((long)ppvVar33 + -8) = 0x3e5722;
      Js::InterpreterStackFrame::SetLocalFrameDisplay((InterpreterStackFrame *)this_02,pFVar28);
      *(undefined8 *)((long)ppvVar33 + -8) = 0x3e572f;
      Js::InterpreterStackFrame::SetNonVarReg((InterpreterStackFrame *)this_02,RVar14,(Var)0x0);
    }
  }
  if (RVar15 != 0xffffffff) {
    *(undefined8 *)((long)ppvVar33 + -8) = 0x3e5740;
    pvVar24 = Js::InterpreterStackFrame::GetNonVarReg((InterpreterStackFrame *)this_02,RVar15);
    if (pvVar24 != (Var)0x0) {
      puVar1 = &local_40->globalBailOutRecordTable->field_0x2c;
      *puVar1 = *puVar1 | 0x20;
      *(undefined8 *)((long)ppvVar33 + -8) = 0x3e575b;
      Js::InterpreterStackFrame::SetLocalClosure((InterpreterStackFrame *)this_02,pvVar24);
      *(undefined8 *)((long)ppvVar33 + -8) = 0x3e5768;
      Js::InterpreterStackFrame::SetNonVarReg((InterpreterStackFrame *)this_02,RVar15,(Var)0x0);
    }
  }
  if (localRegisterID != 0xffffffff) {
    *(undefined8 *)((long)ppvVar33 + -8) = 0x3e5779;
    pvVar24 = Js::InterpreterStackFrame::GetNonVarReg
                        ((InterpreterStackFrame *)this_02,localRegisterID);
    if (pvVar24 != (Var)0x0) {
      *(undefined8 *)((long)ppvVar33 + -8) = 0x3e5789;
      Js::InterpreterStackFrame::SetParamClosure((InterpreterStackFrame *)this_02,pvVar24);
      *(undefined8 *)((long)ppvVar33 + -8) = 0x3e5796;
      Js::InterpreterStackFrame::SetNonVarReg
                ((InterpreterStackFrame *)this_02,localRegisterID,(Var)0x0);
    }
  }
  pBVar35 = local_40;
  pSVar17 = local_70;
  pGVar31 = local_40->globalBailOutRecordTable;
  bVar8 = pGVar31->field_0x2c;
  if ((bVar8 & 0x10) != 0) {
    *(undefined8 *)((long)ppvVar33 + -8) = 0x3e57c3;
    Js::InterpreterStackFrame::TrySetFrameObjectInHeapArgObj
              ((InterpreterStackFrame *)this_02,pSVar17,(bool)((bVar8 & 8) >> 3),
               (bool)((bVar8 & 0x20) >> 5));
    pGVar31 = pBVar35->globalBailOutRecordTable;
    bVar8 = pGVar31->field_0x2c;
  }
  pFVar16 = local_38;
  pGVar31->field_0x2c = bVar8 & 0xdf;
  *(undefined8 *)((long)ppvVar33 + -8) = 0x3e57d7;
  uVar11 = Js::FunctionBody::GetInnerScopeCount(pFVar16);
  for (index = 0; pFVar16 = local_38, pSVar29 = local_68, uVar11 != index; index = index + 1) {
    *(undefined8 *)((long)ppvVar33 + -8) = 0x3e57eb;
    RVar14 = Js::FunctionBody::GetFirstInnerScopeRegister(pFVar16);
    *(undefined8 *)((long)ppvVar33 + -8) = 0x3e57fa;
    pvVar24 = Js::InterpreterStackFrame::GetNonVarReg
                        ((InterpreterStackFrame *)this_02,RVar14 + index);
    *(undefined8 *)((long)ppvVar33 + -8) = 0x3e5808;
    Js::InterpreterStackFrame::SetInnerScopeFromIndex
              ((InterpreterStackFrame *)this_02,index,pvVar24);
    *(undefined8 *)((long)ppvVar33 + -8) = 0x3e5815;
    Js::InterpreterStackFrame::SetNonVarReg
              ((InterpreterStackFrame *)this_02,RVar14 + index,(Var)0x0);
  }
  *(byte *)((long)&this_02[8].m_endLocation + 6) =
       *(byte *)((long)&this_02[8].m_endLocation + 6) & 0xfe |
       ((bailOutKind & BailOutForDebuggerBits) == BailOutInvalid || local_44 != 0);
  scriptFunction =
       (ScriptFunction *)
       (tmpAlloc->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>).
       super_Allocator.outOfMemoryFunc;
  if (local_68 != scriptFunction) {
    *(undefined8 *)((long)ppvVar33 + -8) = 0x3e5853;
    pSVar29 = (ScriptFunction *)
              Js::StackScriptFunction::GetCurrentFunctionObject((JavascriptFunction *)pSVar29);
    if (scriptFunction != pSVar29) {
      AssertCount = AssertCount + 1;
      *(undefined8 *)((long)ppvVar33 + -8) = 0x3e5866;
      Js::Throw::LogAssert();
      *(undefined8 *)((long)ppvVar33 + -8) = 0x3e5876;
      puVar23 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar23 = 1;
      *(undefined8 *)((long)ppvVar33 + -8) = 0x3e589e;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                         ,0x6e6,
                         "(currentFunctionObject == Js::StackScriptFunction::GetCurrentFunctionObject(function))"
                         ,
                         "currentFunctionObject == Js::StackScriptFunction::GetCurrentFunctionObject(function)"
                        );
      if (!bVar7) goto LAB_003e5c94;
      *puVar23 = 0;
    }
    *(undefined8 *)((long)ppvVar33 + -8) = 0x3e58b6;
    Js::InterpreterStackFrame::SetExecutingStackFunction
              ((InterpreterStackFrame *)this_02,scriptFunction);
  }
  pBVar35 = local_40;
  pSVar29 = local_68;
  *(undefined8 *)((long)ppvVar33 + -8) = 0x3e58c3;
  UpdatePolymorphicFieldAccess((JavascriptFunction *)pSVar29,pBVar35);
  pFVar16 = local_38;
  *(undefined8 *)((long)ppvVar33 + -8) = 0x3e58cf;
  uVar11 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar16);
  *(undefined8 *)((long)ppvVar33 + -8) = 0x3e58da;
  LVar12 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar16);
  *(undefined8 *)((long)ppvVar33 + -8) = 0x3e58f5;
  bVar7 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,BailOutPhase,uVar11,LVar12);
  pFVar16 = local_38;
  if (bVar7) {
LAB_003e592f:
    *(undefined8 *)((long)ppvVar33 + -8) = 0x3e5934;
    Output::Flush();
  }
  else {
    *(undefined8 *)((long)ppvVar33 + -8) = 0x3e5905;
    uVar11 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar16);
    *(undefined8 *)((long)ppvVar33 + -8) = 0x3e5910;
    LVar12 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar16);
    *(undefined8 *)((long)ppvVar33 + -8) = 0x3e592b;
    bVar7 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,BailOutPhase,uVar11,LVar12);
    if (bVar7) goto LAB_003e592f;
  }
  pFVar16 = local_38;
  *(undefined8 *)((long)ppvVar33 + -8) = 0x3e593d;
  Js::FunctionBody::BeginExecution(pFVar16);
  uVar10 = local_44;
  *(undefined8 *)((long)ppvVar33 + -8) = 0x3e5948;
  Js::ByteCodeReader::SetCurrentOffset(this_02,uVar10);
  *(undefined8 *)((long)ppvVar33 + -8) = 0x3e595f;
  Js::InterpreterStackFrame::PushPopFrameHelper::PushPopFrameHelper
            ((PushPopFrameHelper *)(debugStringBuffer + 0x28),(InterpreterStackFrame *)this_02,
             returnAddress,&stack0x00000000);
  if (local_45 == '\0') {
    *(undefined8 *)((long)ppvVar33 + -8) = 0x3e597b;
    pvVar24 = Js::InterpreterStackFrame::Process((InterpreterStackFrame *)this_02);
  }
  else {
    *(undefined8 *)((long)ppvVar33 + -8) = 0x3e596d;
    pvVar24 = Js::InterpreterStackFrame::DebugProcess((InterpreterStackFrame *)this_02);
  }
  pBVar35 = local_40;
  *(undefined8 *)((long)ppvVar33 + -8) = 0x3e598e;
  Js::InterpreterStackFrame::PushPopFrameHelper::~PushPopFrameHelper
            ((PushPopFrameHelper *)(debugStringBuffer + 0x28));
  pFVar16 = local_38;
  *(undefined8 *)((long)ppvVar33 + -8) = 0x3e599a;
  Js::FunctionBody::EndExecution(pFVar16);
  if ((pFVar16->dynamicProfileInfo).ptr != (DynamicProfileInfo *)0x0) {
    *(undefined8 *)((long)ppvVar33 + -8) = 0x3e59ad;
    this_03 = Js::FunctionBody::GetAnyDynamicProfileInfo(pFVar16);
    flags = local_60->implicitCallFlags;
    *(undefined8 *)((long)ppvVar33 + -8) = 0x3e59c0;
    Js::DynamicProfileInfo::RecordImplicitCallFlags(this_03,flags);
  }
  if (DAT_0145948a == '\x01') {
    pJVar3 = (JavascriptFunction *)this_02[5].m_currentLocation;
    *(undefined8 *)((long)ppvVar33 + -8) = 0x3e59e2;
    pFVar16 = Js::JavascriptFunction::GetFunctionBody(pJVar3);
    *(undefined8 *)((long)ppvVar33 + -8) = 0x3e59ea;
    uVar11 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar16);
    pJVar3 = (JavascriptFunction *)this_02[5].m_currentLocation;
    *(undefined8 *)((long)ppvVar33 + -8) = 0x3e59f9;
    pFVar16 = Js::JavascriptFunction::GetFunctionBody(pJVar3);
    *(undefined8 *)((long)ppvVar33 + -8) = 0x3e5a01;
    LVar12 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar16);
    pBVar35 = local_40;
    *(undefined8 *)((long)ppvVar33 + -8) = 0x3e5a20;
    bVar7 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,BailOutPhase,uVar11,LVar12);
    if (bVar7) {
      if (DAT_0145c3a8 != DAT_0145c3b0) {
        *(undefined8 *)((long)ppvVar33 + -8) = 0x3e5a49;
        bVar7 = Js::NumberSet::Contains((NumberSet *)&DAT_0145c388,bailOutKind);
        if (!bVar7) goto LAB_003e5a5e;
      }
      *(undefined8 *)((long)ppvVar33 + -8) = 0x3e5a5e;
      Output::Print(L"BailOut:   Return Value: 0x%p",pvVar24);
    }
  }
LAB_003e5a5e:
  pFVar16 = local_38;
  if ((pBVar35->globalBailOutRecordTable->field_0x2c & 2) != 0) {
    *(undefined8 *)((long)ppvVar33 + -8) = 0x3e5a74;
    bVar7 = Js::FunctionProxy::IsGenerator((FunctionProxy *)pFVar16);
    if (bVar7) {
      AssertCount = AssertCount + 1;
      *(undefined8 *)((long)ppvVar33 + -8) = 0x3e5a86;
      Js::Throw::LogAssert();
      *(undefined8 *)((long)ppvVar33 + -8) = 0x3e5a96;
      puVar23 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar23 = 1;
      *(undefined8 *)((long)ppvVar33 + -8) = 0x3e5abe;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                         ,0x70c,"(!executeFunction->IsGenerator())",
                         "Generator functions are not expected to be inlined. If this changes then need to use the real user args here from the generator object"
                        );
      if (!bVar7) goto LAB_003e5c94;
      *puVar23 = 0;
    }
    if (((ulong)local_58->Info & 0xffffff) == 0) {
      AssertCount = AssertCount + 1;
      *(undefined8 *)((long)ppvVar33 + -8) = 0x3e5ae3;
      Js::Throw::LogAssert();
      *(undefined8 *)((long)ppvVar33 + -8) = 0x3e5af3;
      puVar23 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar23 = 1;
      *(undefined8 *)((long)ppvVar33 + -8) = 0x3e5b1b;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                         ,0x70d,"(args.Info.Count != 0)","args.Info.Count != 0");
      if (!bVar7) {
LAB_003e5c94:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar23 = 0;
    }
    pSVar29 = local_68;
    pvVar22 = *local_58->Values;
    *(undefined8 *)((long)ppvVar33 + -8) = 0x3e5b3f;
    pvVar22 = Js::JavascriptFunction::FinishConstructor
                        (pvVar24,pvVar22,(JavascriptFunction *)pSVar29,false);
    *(undefined8 *)((long)ppvVar33 + -8) = 1;
    pSVar17 = local_70;
    uVar30 = *(undefined8 *)((long)ppvVar33 + -8);
    *(undefined8 *)((long)ppvVar33 + -8) = 0x3e5b53;
    pvVar24 = Js::JavascriptOperators::BoxStackInstance(pvVar22,pSVar17,SUB81(uVar30,0),false);
    if ((pvVar22 != pvVar24) && (DAT_0145948a == '\x01')) {
      pJVar3 = (JavascriptFunction *)this_02[5].m_currentLocation;
      *(undefined8 *)((long)ppvVar33 + -8) = 0x3e5b7a;
      pFVar16 = Js::JavascriptFunction::GetFunctionBody(pJVar3);
      *(undefined8 *)((long)ppvVar33 + -8) = 0x3e5b82;
      uVar11 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar16);
      pJVar3 = (JavascriptFunction *)this_02[5].m_currentLocation;
      *(undefined8 *)((long)ppvVar33 + -8) = 0x3e5b90;
      pFVar16 = Js::JavascriptFunction::GetFunctionBody(pJVar3);
      *(undefined8 *)((long)ppvVar33 + -8) = 0x3e5b98;
      LVar12 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar16);
      *(undefined8 *)((long)ppvVar33 + -8) = 0x3e5bb2;
      bVar7 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,BailOutPhase,uVar11,LVar12);
      if (bVar7) {
        if (DAT_0145c3a8 != DAT_0145c3b0) {
          *(undefined8 *)((long)ppvVar33 + -8) = 0x3e5bdc;
          bVar7 = Js::NumberSet::Contains((NumberSet *)&DAT_0145c388,bailOutKind);
          if (!bVar7) goto LAB_003e5bf1;
        }
        *(undefined8 *)((long)ppvVar33 + -8) = 0x3e5bf1;
        Output::Print(L" (Boxed: 0x%p)",pvVar24);
      }
    }
  }
LAB_003e5bf1:
  if (DAT_0145948a == '\x01') {
    pJVar3 = (JavascriptFunction *)this_02[5].m_currentLocation;
    *(undefined8 *)((long)ppvVar33 + -8) = 0x3e5c0c;
    pFVar16 = Js::JavascriptFunction::GetFunctionBody(pJVar3);
    *(undefined8 *)((long)ppvVar33 + -8) = 0x3e5c14;
    uVar11 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar16);
    pJVar3 = (JavascriptFunction *)this_02[5].m_currentLocation;
    *(undefined8 *)((long)ppvVar33 + -8) = 0x3e5c22;
    pFVar16 = Js::JavascriptFunction::GetFunctionBody(pJVar3);
    *(undefined8 *)((long)ppvVar33 + -8) = 0x3e5c2a;
    LVar12 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar16);
    *(undefined8 *)((long)ppvVar33 + -8) = 0x3e5c47;
    bVar7 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,BailOutPhase,uVar11,LVar12);
    if (bVar7) {
      if (DAT_0145c3a8 != DAT_0145c3b0) {
        *(undefined8 *)((long)ppvVar33 + -8) = 0x3e5c70;
        bVar7 = Js::NumberSet::Contains((NumberSet *)&DAT_0145c388,bailOutKind);
        if (!bVar7) {
          return pvVar24;
        }
      }
      *(undefined8 *)((long)ppvVar33 + -8) = 0x3e5c82;
      Output::Print(L"\n");
    }
  }
  return pvVar24;
}

Assistant:

Js::Var
BailOutRecord::BailOutHelper(Js::JavascriptCallStackLayout * layout, Js::ScriptFunction ** functionRef, Js::Arguments& args, const bool isInlinee,
    BailOutRecord const * bailOutRecord, uint32 bailOutOffset, void * returnAddress, IR::BailOutKind bailOutKind, Js::Var * registerSaves, BailOutReturnValue * bailOutReturnValue, Js::Var* pArgumentsObject,
    Js::Var branchValue, void * argoutRestoreAddress)
{
    Js::ScriptFunction * function = *functionRef;
    Js::FunctionBody * executeFunction = function->GetFunctionBody();
    Js::ScriptContext * functionScriptContext = executeFunction->GetScriptContext();

    // Whether to enter StartCall while doing RestoreValues. We don't do that when bailout due to ignore exception under debugger.
    bool useStartCall = true;

    // Clear the disable implicit call bit in case we bail from that region
    functionScriptContext->GetThreadContext()->ClearDisableImplicitFlags();

#ifdef ENABLE_SCRIPT_DEBUGGING
    bool isInDebugMode = executeFunction->IsInDebugMode();

    // Adjust bailout offset for debug mode (only scenario when we ignore exception).
    if (isInDebugMode)
    {
        Js::DebugManager* debugManager = functionScriptContext->GetThreadContext()->GetDebugManager();
        DebuggingFlags* debuggingFlags = debugManager->GetDebuggingFlags();
        int byteCodeOffsetAfterEx = debuggingFlags->GetByteCodeOffsetAfterIgnoreException();

        // Note that in case where bailout for ignore exception immediately follows regular bailout after a helper,
        // and ignore exception happens, we would bail out with non-exception kind with exception data recorded.
        // In this case we need to treat the bailout as ignore exception one and continue to next/set stmt.
        // This is fine because we only set byteCodeOffsetAfterEx for helpers (HelperMethodWrapper, when enabled)
        // and ignore exception is needed for all helpers.
        if ((bailOutKind & IR::BailOutIgnoreException) || byteCodeOffsetAfterEx != DebuggingFlags::InvalidByteCodeOffset)
        {
            bool needResetData = true;

            // Note: the func # in debuggingFlags still can be 0 in case actual b/o reason was not BailOutIgnoreException,
            //       but BailOutIgnoreException was on the OR'ed values for b/o check.
            bool isSameFunction = debuggingFlags->GetFuncNumberAfterIgnoreException() == DebuggingFlags::InvalidFuncNumber ||
                debuggingFlags->GetFuncNumberAfterIgnoreException() == function->GetFunctionBody()->GetFunctionNumber();
            AssertMsg(isSameFunction, "Bailout due to ignore exception in different function, can't bail out cross functions!");

            if (isSameFunction)
            {
                Assert(!(byteCodeOffsetAfterEx == DebuggingFlags::InvalidByteCodeOffset && debuggingFlags->GetFuncNumberAfterIgnoreException() != DebuggingFlags::InvalidFuncNumber));

                if (byteCodeOffsetAfterEx != DebuggingFlags::InvalidByteCodeOffset)
                {
                    // We got an exception in native frame, and need to bail out to interpreter
                    if (debugManager->stepController.IsActive())
                    {
                        // Native frame went away, and there will be interpreter frame on its place.
                        // Make sure that frameAddrWhenSet it less than current interpreter frame -- we use it to detect stack depth.
                        debugManager->stepController.SetFrameAddr(0);
                    }

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
                    if (bailOutOffset != (uint)byteCodeOffsetAfterEx || !(bailOutKind & IR::BailOutIgnoreException))
                    {
                        char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                        BAILOUT_KIND_TRACE(executeFunction, bailOutKind, _u("BailOut: changing due to ignore exception: function: %s (%s) offset: #%04x -> #%04x Opcode: %s Treating as: %S"), executeFunction->GetDisplayName(),
                            executeFunction->GetDebugNumberSet(debugStringBuffer), bailOutOffset, byteCodeOffsetAfterEx, Js::OpCodeUtil::GetOpCodeName(bailOutRecord->bailOutOpcode), ::GetBailOutKindName(IR::BailOutIgnoreException));
                        BAILOUT_TESTTRACE(executeFunction, bailOutKind, _u("BailOut: changing due to ignore exception: function %s, Opcode: %s, Treating as: %S"), executeFunction->GetDisplayName(),
                            Js::OpCodeUtil::GetOpCodeName(bailOutRecord->bailOutOpcode), ::GetBailOutKindName(IR::BailOutIgnoreException));
                    }
#endif

                    // Set the byte code offset to continue from next user statement.
                    bailOutOffset = byteCodeOffsetAfterEx;

                    // Reset current call count so that we don't do StartCall for inner calls. See WinBlue 272569.
                    // The idea is that next statement can never be set to the inner StartCall (another call as part of an ArgOut),
                    // it will be next statement in the function.
                    useStartCall = false;
                }
                else
                {
                    needResetData = false;
                }
            }

            if (needResetData)
            {
                // Reset/correct the flag as either we processed it or we need to correct wrong flag.
                debuggingFlags->ResetByteCodeOffsetAndFuncAfterIgnoreException();
            }
        }
    }
#endif

#if defined(DBG_DUMP) || defined(ENABLE_DEBUG_CONFIG_OPTIONS)
    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif
    BAILOUT_KIND_TRACE(executeFunction, bailOutKind, _u("BailOut: function: %s (%s) offset: #%04x Opcode: %s"), executeFunction->GetDisplayName(),
        executeFunction->GetDebugNumberSet(debugStringBuffer), bailOutOffset, Js::OpCodeUtil::GetOpCodeName(bailOutRecord->bailOutOpcode));
    BAILOUT_TESTTRACE(executeFunction, bailOutKind, _u("BailOut: function %s, Opcode: %s"), executeFunction->GetDisplayName(), Js::OpCodeUtil::GetOpCodeName(bailOutRecord->bailOutOpcode));

    if (isInlinee && args.Info.Count != 0)
    {
        // Box arguments. Inlinee arguments may be allocated on the stack.
        for(uint i = 0; i < args.Info.Count; ++i)
        {
            const Js::Var arg = args.Values[i];
            BAILOUT_VERBOSE_TRACE(executeFunction, bailOutKind, _u("BailOut:   Argument #%3u: value: 0x%p"), i, arg);
            const Js::Var boxedArg = Js::JavascriptOperators::BoxStackInstance(arg, functionScriptContext, /* allowStackFunction */ true, /* deepCopy */ false);
            if(boxedArg != arg)
            {
                args.Values[i] = boxedArg;
                BAILOUT_VERBOSE_TRACE(executeFunction, bailOutKind, _u(" (Boxed: 0x%p)"), boxedArg);
            }
            BAILOUT_VERBOSE_TRACE(executeFunction, bailOutKind, _u("\n"));
        }
    }

    bool fReleaseAlloc = false;
    Js::InterpreterStackFrame* newInstance = nullptr;
    Js::Var* allocation = nullptr;

    if (executeFunction->IsCoroutine())
    {
        // If the FunctionBody is a generator then this call is being made by one of the three
        // generator resuming methods: next(), throw(), or return(). They all pass the generator
        // object as the first of two arguments. The real user arguments are obtained from the
        // generator object. The second argument is the resume yield object which is only needed
        // when resuming a generator and not needed when yielding from a generator, as is occurring here.
        AssertMsg(args.Info.Count == 2, "Generator ScriptFunctions should only be invoked by generator APIs with the pair of arguments they pass in -- the generator object and a resume yield object");
        Js::JavascriptGenerator* generator = Js::VarTo<Js::JavascriptGenerator>(args[0]);
        newInstance = generator->GetFrame();

        // The jit relies on the interpreter stack frame to store various information such as
        // for-in enumerators. Therefore, we always create an interpreter stack frame for generator
        // as part of the resume jump table, at the beginning of the jit'd function, if it doesn't
        // already exist.
        Assert(newInstance != nullptr);

        // BailOut will recompute OutArg pointers based on BailOutRecord. Reset them back
        // to initial position before that happens so that OP_StartCall calls don't accumulate
        // incorrectly over multiple yield bailouts.
        newInstance->ResetOut();

        // The debugger relies on comparing stack addresses of frames to decide when a step_out is complete so
        // give the InterpreterStackFrame a legit enough stack address to make this comparison work.
        newInstance->m_stackAddress = reinterpret_cast<DWORD_PTR>(&generator);
    }
    else
    {
        Js::InterpreterStackFrame::Setup setup(function, args, true /* bailedOut */, isInlinee);
        size_t varAllocCount = setup.GetAllocationVarCount();
        size_t stackVarAllocCount = setup.GetStackAllocationVarCount();
        size_t varSizeInBytes;
        Js::Var *stackAllocation = nullptr;

        // If the locals area exceeds a certain limit, allocate it from a private arena rather than
        // this frame. The current limit is based on an old assert on the number of locals we would allow here.
        if ((varAllocCount + stackVarAllocCount) > Js::InterpreterStackFrame::LocalsThreshold)
        {
            ArenaAllocator *tmpAlloc = nullptr;
            fReleaseAlloc = functionScriptContext->EnsureInterpreterArena(&tmpAlloc);
            varSizeInBytes = varAllocCount * sizeof(Js::Var);
            allocation = (Js::Var*)tmpAlloc->Alloc(varSizeInBytes);
            if (stackVarAllocCount != 0)
            {
                size_t stackVarSizeInBytes = stackVarAllocCount * sizeof(Js::Var);
                PROBE_STACK_PARTIAL_INITIALIZED_BAILOUT_FRAME(functionScriptContext, Js::Constants::MinStackInterpreter + stackVarSizeInBytes, returnAddress);
                stackAllocation = (Js::Var*)_alloca(stackVarSizeInBytes);
            }
        }
        else
        {
            varSizeInBytes = (varAllocCount + stackVarAllocCount) * sizeof(Js::Var);
            PROBE_STACK_PARTIAL_INITIALIZED_BAILOUT_FRAME(functionScriptContext, Js::Constants::MinStackInterpreter + varSizeInBytes, returnAddress);
            allocation = (Js::Var*)_alloca(varSizeInBytes);
        }

        Js::LoopHeader* loopHeaderArray = nullptr;

        if (executeFunction->GetHasAllocatedLoopHeaders())
        {
            // Loop header array is recycler allocated, so we push it on the stack
            // When we scan the stack, we'll recognize it as a recycler allocated
            // object, and mark it's contents and keep the individual loop header
            // wrappers alive
            loopHeaderArray = executeFunction->GetLoopHeaderArrayPtr();
        }

        // Set stack address for STEP_OUT/recursion detection for new frame.
        // This frame is originally jitted frame for which we create a new interpreter frame on top of it on stack,
        // set the stack address to some stack location that belong to the original jitted frame.
        DWORD_PTR frameStackAddr = reinterpret_cast<DWORD_PTR>(layout->GetArgv());

        // Initialize the interpreter stack frame (constants) but not the param, the bailout record will restore the value
#if DBG
        Js::Var invalidStackVar = (Js::RecyclableObject*)_alloca(sizeof(Js::RecyclableObject));
        memset(invalidStackVar, 0xFE, sizeof(Js::RecyclableObject));
#endif

        newInstance = setup.InitializeAllocation(allocation, stackAllocation, false, false, loopHeaderArray, frameStackAddr
#if DBG
            , invalidStackVar
#endif
            );

        newInstance->m_reader.Create(executeFunction);
    }

    int forInEnumeratorArrayRestoreOffset = bailOutRecord->globalBailOutRecordTable->forInEnumeratorArrayRestoreOffset;
    if (forInEnumeratorArrayRestoreOffset != -1)
    {
        newInstance->forInObjectEnumerators = layout->GetForInObjectEnumeratorArrayAtOffset(forInEnumeratorArrayRestoreOffset);
    }

    newInstance->ehBailoutData = bailOutRecord->ehBailoutData;
    newInstance->OrFlags(Js::InterpreterStackFrameFlags_FromBailOut);
    if (bailOutKind == IR::BailOutOnArrayAccessHelperCall)
    {
        newInstance->OrFlags(Js::InterpreterStackFrameFlags_ProcessingBailOutOnArrayAccessHelperCall);
    }
    else if (bailOutKind == IR::BailOutOnNotNativeArray)
    {
        newInstance->OrFlags(Js::InterpreterStackFrameFlags_ProcessingBailOutOnArraySpecialization);
    }

    if (isInlinee)
    {
        newInstance->OrFlags(Js::InterpreterStackFrameFlags_FromBailOutInInlinee);
    }

    ThreadContext *threadContext = newInstance->GetScriptContext()->GetThreadContext();

    // If this is a bailout on implicit calls, then it must have occurred at the current statement.
    // Otherwise, assume that the bits are stale, so clear them before entering the interpreter.
    if (!BailOutInfo::IsBailOutOnImplicitCalls(bailOutKind))
    {
        threadContext->ClearImplicitCallFlags();
    }

    Js::RegSlot varCount = function->GetFunctionBody()->GetVarCount();
    if (varCount)
    {
        Js::RegSlot constantCount = function->GetFunctionBody()->GetConstantCount();
        memset(newInstance->m_localSlots + constantCount, 0, varCount * sizeof(Js::Var));
    }

    Js::RegSlot localFrameDisplayReg = executeFunction->GetLocalFrameDisplayRegister();
    Js::RegSlot localClosureReg = executeFunction->GetLocalClosureRegister();
    Js::RegSlot paramClosureReg = executeFunction->GetParamClosureRegister();

    if (!isInlinee)
    {
        // If byte code was generated to do stack closures, restore closure pointers before the normal RestoreValues.
        // If code was jitted for stack closures, we have to restore the pointers from known stack locations.
        // (RestoreValues won't do it.) If stack closures were disabled for this function before we jitted,
        // then the values on the stack are garbage, but if we need them then RestoreValues will overwrite with
        // the correct values.
        if (localFrameDisplayReg != Js::Constants::NoRegister)
        {
            Js::FrameDisplay *localFrameDisplay;
            uintptr_t frameDisplayIndex = (uintptr_t)(
#if _M_IX86 || _M_AMD64
                executeFunction->GetInParamsCount() == 0 ?
                Js::JavascriptFunctionArgIndex_StackFrameDisplayNoArg :
#endif
                Js::JavascriptFunctionArgIndex_StackFrameDisplay) - 2;

            localFrameDisplay = (Js::FrameDisplay*)layout->GetArgv()[frameDisplayIndex];
            newInstance->SetLocalFrameDisplay(localFrameDisplay);
        }

        if (localClosureReg != Js::Constants::NoRegister)
        {
            Js::Var localClosure;
            uintptr_t scopeSlotsIndex = (uintptr_t)(
#if _M_IX86 || _M_AMD64
                executeFunction->GetInParamsCount() == 0 ?
                Js::JavascriptFunctionArgIndex_StackScopeSlotsNoArg :
#endif
                Js::JavascriptFunctionArgIndex_StackScopeSlots) - 2;

            localClosure = layout->GetArgv()[scopeSlotsIndex];
            newInstance->SetLocalClosure(localClosure);
        }
    }

    // Restore bailout values
    bailOutRecord->RestoreValues(bailOutKind, layout, newInstance, functionScriptContext, false, registerSaves, bailOutReturnValue, pArgumentsObject, branchValue, returnAddress, useStartCall, argoutRestoreAddress);

    // For functions that don't get the scope slot and frame display pointers back from the known stack locations
    // (see above), get them back from the designated registers.
    // In either case, clear the values from those registers, because the interpreter should not be able to access
    // those values through the registers (only through its private fields).

    if (localFrameDisplayReg != Js::Constants::NoRegister)
    {
        Js::FrameDisplay *frameDisplay = (Js::FrameDisplay*)newInstance->GetNonVarReg(localFrameDisplayReg);
        if (frameDisplay)
        {
            newInstance->SetLocalFrameDisplay(frameDisplay);
            newInstance->SetNonVarReg(localFrameDisplayReg, nullptr);
        }
    }

    if (localClosureReg != Js::Constants::NoRegister)
    {
        Js::Var closure = newInstance->GetNonVarReg(localClosureReg);
        if (closure)
        {
            bailOutRecord->globalBailOutRecordTable->isScopeObjRestored = true;
            newInstance->SetLocalClosure(closure);
            newInstance->SetNonVarReg(localClosureReg, nullptr);
        }
    }

    if (paramClosureReg != Js::Constants::NoRegister)
    {
        Js::Var closure = newInstance->GetNonVarReg(paramClosureReg);
        if (closure)
        {
            newInstance->SetParamClosure(closure);
            newInstance->SetNonVarReg(paramClosureReg, nullptr);
        }
    }

    if (bailOutRecord->globalBailOutRecordTable->hasStackArgOpt)
    {
        newInstance->TrySetFrameObjectInHeapArgObj(functionScriptContext, bailOutRecord->globalBailOutRecordTable->hasNonSimpleParams,
            bailOutRecord->globalBailOutRecordTable->isScopeObjRestored);
    }

    //Reset the value for tracking the restoration during next bail out.
    bailOutRecord->globalBailOutRecordTable->isScopeObjRestored = false;

    uint32 innerScopeCount = executeFunction->GetInnerScopeCount();
    for (uint32 i = 0; i < innerScopeCount; i++)
    {
        Js::RegSlot reg = executeFunction->GetFirstInnerScopeRegister() + i;
        newInstance->SetInnerScopeFromIndex(i, newInstance->GetNonVarReg(reg));
        newInstance->SetNonVarReg(reg, nullptr);
    }

    newInstance->SetClosureInitDone(bailOutOffset != 0 || !(bailOutKind & IR::BailOutForDebuggerBits));

    // RestoreValues may call EnsureArguments and cause functions to be boxed.
    // Since the interpreter frame that hasn't started yet, StackScriptFunction::Box would not have replaced the function object
    // in the restoring interpreter frame. Let's make sure the current interpreter frame has the unboxed version.
    // Note: Only use the unboxed version if we have replaced the function argument on the stack via boxing
    // so that the interpreter frame we are bailing out to matches the one in the function argument list
    // (which is used by the stack walker to match up stack frame and the interpreter frame).
    // Some function are boxed but we continue to use the stack version to call the function - those that only live in register
    // and are not captured in frame displays.
    // Those uses are fine, but that means the function argument list will have the stack function object that is passed it and
    // not be replaced with a just boxed one.

    Js::ScriptFunction * currentFunctionObject = *functionRef;
    if (function != currentFunctionObject)
    {
        Assert(currentFunctionObject == Js::StackScriptFunction::GetCurrentFunctionObject(function));
        newInstance->SetExecutingStackFunction(currentFunctionObject);
    }

    UpdatePolymorphicFieldAccess(function, bailOutRecord);

    BAILOUT_FLUSH(executeFunction);

    executeFunction->BeginExecution();

    // Restart at the bailout byte code offset.
    newInstance->m_reader.SetCurrentOffset(bailOutOffset);

    Js::Var aReturn = nullptr;

    {
        // Following _AddressOfReturnAddress <= real address of "returnAddress". Suffices for RemoteStackWalker to test partially initialized interpreter frame.
        Js::InterpreterStackFrame::PushPopFrameHelper pushPopFrameHelper(newInstance, returnAddress, _AddressOfReturnAddress());
#ifdef ENABLE_SCRIPT_DEBUGGING
        aReturn = isInDebugMode ? newInstance->DebugProcess() : newInstance->Process();
#else
        aReturn = newInstance->Process();
#endif
        // Note: in debug mode we always have to bailout to debug thunk,
        //       as normal interpreter thunk expects byte code compiled w/o debugging.
    }

    executeFunction->EndExecution();

    if (executeFunction->HasDynamicProfileInfo())
    {
        Js::DynamicProfileInfo *dynamicProfileInfo = executeFunction->GetAnyDynamicProfileInfo();
        dynamicProfileInfo->RecordImplicitCallFlags(threadContext->GetImplicitCallFlags());
    }

    BAILOUT_VERBOSE_TRACE(newInstance->function->GetFunctionBody(), bailOutKind, _u("BailOut:   Return Value: 0x%p"), aReturn);
    if (bailOutRecord->globalBailOutRecordTable->isInlinedConstructor)
    {
        AssertMsg(!executeFunction->IsGenerator(), "Generator functions are not expected to be inlined. If this changes then need to use the real user args here from the generator object");
        Assert(args.Info.Count != 0);
        aReturn = Js::JavascriptFunction::FinishConstructor(aReturn, args.Values[0], function);

        Js::Var oldValue = aReturn;
        aReturn = Js::JavascriptOperators::BoxStackInstance(oldValue, functionScriptContext, /* allowStackFunction */ true, /* deepCopy */ false);
#if ENABLE_DEBUG_CONFIG_OPTIONS
        if (oldValue != aReturn)
        {
            BAILOUT_VERBOSE_TRACE(newInstance->function->GetFunctionBody(), bailOutKind, _u(" (Boxed: 0x%p)"), aReturn);
        }
#endif
    }
    BAILOUT_VERBOSE_TRACE(newInstance->function->GetFunctionBody(), bailOutKind, _u("\n"));
    return aReturn;
}